

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_revisiondate(lysp_yang_ctx *ctx,char *rev,lysp_ext_instance **exts)

{
  size_t __n;
  LY_ERR LVar1;
  char *format;
  ly_ctx *plVar2;
  char *pcVar3;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  ly_stmt local_4c;
  size_t local_48;
  char *local_40;
  char *local_38;
  
  if (*rev == '\0') {
    LVar1 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_40,&local_38,&local_48);
    pcVar3 = local_40;
    __n = local_48;
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    LVar1 = lysp_check_date((lysp_ctx *)ctx,local_40,local_48,"revision-date");
    if (LVar1 != LY_SUCCESS) {
      free(local_38);
      return LY_EVALID;
    }
    strncpy(rev,pcVar3,__n);
    free(local_38);
    LVar1 = get_keyword(ctx,&local_4c,&local_40,&local_48);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if (local_4c == LY_STMT_SYNTAX_SEMICOLON) {
      return LY_SUCCESS;
    }
    if (local_4c == LY_STMT_SYNTAX_LEFT_BRACE) {
      LVar1 = get_keyword(ctx,&local_4c,&local_40,&local_48);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if (local_4c == LY_STMT_SYNTAX_RIGHT_BRACE) {
        return LY_SUCCESS;
      }
      do {
        if (local_4c != LY_STMT_EXTENSION_INSTANCE) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar2 = (ly_ctx *)0x0;
          }
          else {
            plVar2 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar3 = lyplg_ext_stmt2str(local_4c);
          ly_vlog(plVar2,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                  ,pcVar3,"revision-date");
          return LY_EVALID;
        }
        LVar1 = parse_ext(ctx,local_40,local_48,rev,LY_STMT_REVISION_DATE,0,exts);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        LVar1 = get_keyword(ctx,&local_4c,&local_40,&local_48);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
      } while (local_4c != LY_STMT_SYNTAX_RIGHT_BRACE);
      return LY_SUCCESS;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar2 = (ly_ctx *)0x0;
    }
    else {
      plVar2 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar3 = lyplg_ext_stmt2str(local_4c);
    format = "Invalid keyword \"%s\", expected \";\" or \"{\".";
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar2 = (ly_ctx *)0x0;
    }
    else {
      plVar2 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Duplicate keyword \"%s\".";
    pcVar3 = "revision-date";
  }
  ly_vlog(plVar2,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar3);
  return LY_EVALID;
}

Assistant:

static LY_ERR
parse_revisiondate(struct lysp_yang_ctx *ctx, char *rev, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (rev[0]) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "revision-date");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    /* check value */
    if (lysp_check_date((struct lysp_ctx *)ctx, word, word_len, "revision-date")) {
        free(buf);
        return LY_EVALID;
    }

    /* store value and spend buf if allocated */
    strncpy(rev, word, word_len);
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, rev, LY_STMT_REVISION_DATE, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "revision-date");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}